

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int archive_write_gnutar_header(archive_write *a,archive_entry *entry)

{
  long *plVar1;
  void *buff_00;
  mode_t mVar2;
  wchar_t wVar3;
  int iVar4;
  archive_string_conv *paVar5;
  char *pcVar6;
  size_t sVar7;
  archive_string *paVar8;
  int *piVar9;
  char *pcVar10;
  size_t sVar11;
  archive_entry *paVar12;
  la_int64_t lVar13;
  archive_entry *temp_1;
  size_t length_1;
  char *pathname;
  archive_entry *temp;
  size_t length;
  archive_string as;
  size_t path_length;
  char *p;
  archive_entry *entry_main;
  archive_string_conv *sconv;
  gnutar *gnutar;
  int iStack_230;
  char tartype;
  int ret2;
  int ret;
  int r;
  char buff [512];
  archive_entry *entry_local;
  archive_write *a_local;
  
  gnutar._4_4_ = 0;
  plVar1 = (long *)a->format_data;
  if (plVar1[10] == 0) {
    if ((int)plVar1[0xc] == 0) {
      paVar5 = archive_string_default_conversion_for_write((archive_conflict *)a);
      plVar1[0xb] = (long)paVar5;
      *(undefined4 *)(plVar1 + 0xc) = 1;
    }
    entry_main = (archive_entry *)plVar1[0xb];
  }
  else {
    entry_main = (archive_entry *)plVar1[10];
  }
  pcVar6 = archive_entry_hardlink(entry);
  if (((pcVar6 != (char *)0x0) || (pcVar6 = archive_entry_symlink(entry), pcVar6 != (char *)0x0)) ||
     (mVar2 = archive_entry_filetype(entry), mVar2 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar2 = archive_entry_filetype(entry);
  if (((mVar2 == 0x4000) && (pcVar6 = archive_entry_pathname(entry), pcVar6 != (char *)0x0)) &&
     ((*pcVar6 != '\0' && (sVar7 = strlen(pcVar6), pcVar6[sVar7 - 1] != '/')))) {
    length = 0;
    as.s = (char *)0x0;
    as.length = 0;
    as.buffer_length = strlen(pcVar6);
    paVar8 = archive_string_ensure((archive_string *)&length,as.buffer_length + 2);
    if (paVar8 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate ustar data");
      archive_string_free((archive_string *)&length);
      return -0x1e;
    }
    as.s = (char *)0x0;
    archive_strncat((archive_string *)&length,pcVar6,as.buffer_length);
    archive_strappend_char((archive_string *)&length,'/');
    archive_entry_copy_pathname(entry,(char *)length);
    archive_string_free((archive_string *)&length);
  }
  wVar3 = _archive_entry_pathname_l
                    (entry,(char **)(plVar1 + 4),(size_t *)(plVar1 + 5),
                     (archive_string_conv *)entry_main);
  if (wVar3 != L'\0') {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for pathname");
      iStack_230 = -0x1e;
      iVar4 = iStack_230;
      goto LAB_001a6a4c;
    }
    pcVar6 = archive_entry_pathname(entry);
    pcVar10 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar6,pcVar10);
    gnutar._4_4_ = -0x14;
  }
  wVar3 = _archive_entry_uname_l
                    (entry,(char **)(plVar1 + 6),(size_t *)(plVar1 + 7),
                     (archive_string_conv *)entry_main);
  if (wVar3 != L'\0') {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Uname");
      iStack_230 = -0x1e;
      iVar4 = iStack_230;
      goto LAB_001a6a4c;
    }
    pcVar6 = archive_entry_uname(entry);
    pcVar10 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate uname \'%s\' to %s",pcVar6,pcVar10);
    gnutar._4_4_ = -0x14;
  }
  wVar3 = _archive_entry_gname_l
                    (entry,(char **)(plVar1 + 8),(size_t *)(plVar1 + 9),
                     (archive_string_conv *)entry_main);
  if (wVar3 != L'\0') {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Gname");
      iStack_230 = -0x1e;
      iVar4 = iStack_230;
      goto LAB_001a6a4c;
    }
    pcVar6 = archive_entry_gname(entry);
    pcVar10 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate gname \'%s\' to %s",pcVar6,pcVar10);
    gnutar._4_4_ = -0x14;
  }
  wVar3 = _archive_entry_hardlink_l
                    (entry,(char **)(plVar1 + 2),(size_t *)(plVar1 + 3),
                     (archive_string_conv *)entry_main);
  if (wVar3 != L'\0') {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
      iStack_230 = -0x1e;
      iVar4 = iStack_230;
      goto LAB_001a6a4c;
    }
    pcVar6 = archive_entry_hardlink(entry);
    pcVar10 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar6,pcVar10);
    gnutar._4_4_ = -0x14;
  }
  if ((plVar1[3] == 0) &&
     (wVar3 = _archive_entry_symlink_l
                        (entry,(char **)(plVar1 + 2),(size_t *)(plVar1 + 3),
                         (archive_string_conv *)entry_main), wVar3 != L'\0')) {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
      iStack_230 = -0x1e;
      iVar4 = iStack_230;
      goto LAB_001a6a4c;
    }
    pcVar6 = archive_entry_hardlink(entry);
    pcVar10 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar6,pcVar10);
    gnutar._4_4_ = -0x14;
  }
  if (100 < (ulong)plVar1[3]) {
    sVar11 = plVar1[3] + 1;
    paVar12 = archive_entry_new2((archive_conflict *)a);
    archive_entry_set_uname(paVar12,"root");
    archive_entry_set_gname(paVar12,"wheel");
    archive_entry_set_pathname(paVar12,"././@LongLink");
    archive_entry_set_size(paVar12,sVar11);
    iVar4 = archive_format_gnutar_header(a,(char *)&ret,paVar12,'K');
    archive_entry_free(paVar12);
    if ((((iVar4 < -0x14) || (iVar4 = __archive_write_output(a,&ret,0x200), iVar4 < -0x14)) ||
        (iVar4 = __archive_write_output(a,(void *)plVar1[2],sVar11), iVar4 < -0x14)) ||
       (iVar4 = __archive_write_nulls(a,-sVar11 & 0x1ff), iVar4 < -0x14)) goto LAB_001a6a4c;
  }
  if (100 < (ulong)plVar1[5]) {
    buff_00 = (void *)plVar1[4];
    sVar11 = plVar1[5] + 1;
    paVar12 = archive_entry_new2((archive_conflict *)a);
    archive_entry_set_uname(paVar12,"root");
    archive_entry_set_gname(paVar12,"wheel");
    archive_entry_set_pathname(paVar12,"././@LongLink");
    archive_entry_set_size(paVar12,sVar11);
    iVar4 = archive_format_gnutar_header(a,(char *)&ret,paVar12,'L');
    archive_entry_free(paVar12);
    if (((iVar4 < -0x14) || (iVar4 = __archive_write_output(a,&ret,0x200), iVar4 < -0x14)) ||
       ((iVar4 = __archive_write_output(a,buff_00,sVar11), iVar4 < -0x14 ||
        (iVar4 = __archive_write_nulls(a,-sVar11 & 0x1ff), iVar4 < -0x14)))) goto LAB_001a6a4c;
  }
  wVar3 = archive_entry_hardlink_is_set(entry);
  if (wVar3 == L'\0') {
    mVar2 = archive_entry_filetype(entry);
    if (mVar2 == 0x1000) {
      gnutar._3_1_ = '6';
    }
    else if (mVar2 == 0x2000) {
      gnutar._3_1_ = '3';
    }
    else if (mVar2 == 0x4000) {
      gnutar._3_1_ = '5';
    }
    else if (mVar2 == 0x6000) {
      gnutar._3_1_ = '4';
    }
    else if (mVar2 == 0x8000) {
      gnutar._3_1_ = '0';
    }
    else {
      if (mVar2 != 0xa000) {
        __archive_write_entry_filetype_unsupported(&a->archive,entry,"gnutar");
        iStack_230 = -0x19;
        iVar4 = iStack_230;
        goto LAB_001a6a4c;
      }
      gnutar._3_1_ = '2';
    }
  }
  else {
    gnutar._3_1_ = '1';
  }
  iStack_230 = archive_format_gnutar_header(a,(char *)&ret,entry,gnutar._3_1_);
  iVar4 = iStack_230;
  if (-0x15 < iStack_230) {
    if (gnutar._4_4_ < iStack_230) {
      iStack_230 = gnutar._4_4_;
    }
    iVar4 = __archive_write_output(a,&ret,0x200);
    if (-0x15 < iVar4) {
      if (iVar4 < iStack_230) {
        iStack_230 = iVar4;
      }
      lVar13 = archive_entry_size(entry);
      *plVar1 = lVar13;
      plVar1[1] = -*plVar1 & 0x1ff;
      iVar4 = iStack_230;
    }
  }
LAB_001a6a4c:
  iStack_230 = iVar4;
  archive_entry_free((archive_entry *)0x0);
  return iStack_230;
}

Assistant:

static int
archive_write_gnutar_header(struct archive_write *a,
     struct archive_entry *entry)
{
	char buff[512];
	int r, ret, ret2 = ARCHIVE_OK;
	char tartype;
	struct gnutar *gnutar;
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;

	gnutar = (struct gnutar *)a->format_data;

	/* Setup default string conversion. */
	if (gnutar->opt_sconv == NULL) {
		if (!gnutar->init_default_conversion) {
			gnutar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			gnutar->init_default_conversion = 1;
		}
		sconv = gnutar->sconv_default;
	} else
		sconv = gnutar->opt_sconv;

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[0] != '\0' && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	r = archive_entry_pathname_l(entry, &(gnutar->pathname),
	    &(gnutar->pathname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for pathname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_uname_l(entry, &(gnutar->uname),
	    &(gnutar->uname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate uname '%s' to %s",
		    archive_entry_uname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_gname_l(entry, &(gnutar->gname),
	    &(gnutar->gname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate gname '%s' to %s",
		    archive_entry_gname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}

	/* If linkname is longer than 100 chars we need to add a 'K' header. */
	r = archive_entry_hardlink_l(entry, &(gnutar->linkname),
	    &(gnutar->linkname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_hardlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	if (gnutar->linkname_length == 0) {
		r = archive_entry_symlink_l(entry, &(gnutar->linkname),
		    &(gnutar->linkname_length), sconv);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				ret = ARCHIVE_FATAL;
				goto exit_write_header;
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate linkname '%s' to %s",
			    archive_entry_hardlink(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
	}
	if (gnutar->linkname_length > GNUTAR_linkname_size) {
		size_t length = gnutar->linkname_length + 1;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, length);
		ret = archive_format_gnutar_header(a, buff, temp, 'K');
		archive_entry_free(temp);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Write name and trailing null byte. */
		ret = __archive_write_output(a, gnutar->linkname, length);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Pad to 512 bytes */
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)length));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	/* If pathname is longer than 100 chars we need to add an 'L' header. */
	if (gnutar->pathname_length > GNUTAR_name_size) {
		const char *pathname = gnutar->pathname;
		size_t length = gnutar->pathname_length + 1;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, length);
		ret = archive_format_gnutar_header(a, buff, temp, 'L');
		archive_entry_free(temp);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Write pathname + trailing null byte. */
		ret = __archive_write_output(a, pathname, length);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Pad to multiple of 512 bytes. */
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)length));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	if (archive_entry_hardlink_is_set(entry)) {
		tartype = '1';
	} else
		switch (archive_entry_filetype(entry)) {
		case AE_IFREG: tartype = '0' ; break;
		case AE_IFLNK: tartype = '2' ; break;
		case AE_IFCHR: tartype = '3' ; break;
		case AE_IFBLK: tartype = '4' ; break;
		case AE_IFDIR: tartype = '5' ; break;
		case AE_IFIFO: tartype = '6' ; break;
		default: /* AE_IFSOCK and unknown */
			__archive_write_entry_filetype_unsupported(
                            &a->archive, entry, "gnutar");
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		}

	ret = archive_format_gnutar_header(a, buff, entry, tartype);
	if (ret < ARCHIVE_WARN)
		goto exit_write_header;
	if (ret2 < ret)
		ret = ret2;
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		ret = ret2;
		goto exit_write_header;
	}
	if (ret2 < ret)
		ret = ret2;

	gnutar->entry_bytes_remaining = archive_entry_size(entry);
	gnutar->entry_padding = 0x1ff & (-(int64_t)gnutar->entry_bytes_remaining);
exit_write_header:
	archive_entry_free(entry_main);
	return (ret);
}